

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall
testing::internal::ForkingDeathTest::ForkingDeathTest
          (ForkingDeathTest *this,char *a_statement,RE *a_regex)

{
  DeathTest::DeathTest((DeathTest *)this);
  (this->super_DeathTestImpl).statement_ = a_statement;
  (this->super_DeathTestImpl).regex_ = a_regex;
  (this->super_DeathTestImpl).spawned_ = false;
  (this->super_DeathTestImpl).status_ = -1;
  (this->super_DeathTestImpl).outcome_ = IN_PROGRESS;
  (this->super_DeathTestImpl).read_fd_ = -1;
  (this->super_DeathTestImpl).write_fd_ = -1;
  (this->super_DeathTestImpl).super_DeathTest._vptr_DeathTest =
       (_func_int **)&PTR__DeathTestImpl_001452b0;
  *(undefined4 *)&(this->super_DeathTestImpl).field_0x2c = 0xffffffff;
  return;
}

Assistant:

ForkingDeathTest::ForkingDeathTest(const char* a_statement, const RE* a_regex)
    : DeathTestImpl(a_statement, a_regex),
      child_pid_(-1) {}